

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

void vli_mult(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right)

{
  ulong uVar1;
  long lVar2;
  uECC_word_t *puVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uECC_word_t local_48;
  uECC_word_t r2;
  uECC_word_t r0;
  uECC_word_t r1;
  
  r2 = 0;
  r0 = 0;
  for (uVar1 = 0; local_48 = 0, uVar4 = uVar1, puVar3 = left, uVar1 != 4; uVar1 = uVar1 + 1) {
    for (; uVar4 != 0xffffffffffffffff; uVar4 = uVar4 - 1) {
      muladd(*puVar3,right[uVar4 & 0xffffffff],&r2,&r0,&local_48);
      puVar3 = puVar3 + 1;
    }
    result[uVar1] = r2;
    r2 = r0;
    r0 = local_48;
  }
  lVar6 = 1;
  for (lVar2 = 4; local_48 = 0, puVar3 = right + 3, lVar5 = lVar6, lVar2 != 7; lVar2 = lVar2 + 1) {
    for (; lVar5 != 4; lVar5 = lVar5 + 1) {
      muladd(left[lVar5],*puVar3,&r2,&r0,&local_48);
      puVar3 = puVar3 + -1;
    }
    result[lVar2] = r2;
    r2 = r0;
    r0 = local_48;
    lVar6 = lVar6 + 1;
  }
  result[7] = r2;
  return;
}

Assistant:

static void vli_mult(uECC_word_t *result, const uECC_word_t *left, const uECC_word_t *right) {
    uECC_word_t r0 = 0;
    uECC_word_t r1 = 0;
    uECC_word_t r2 = 0;
    wordcount_t i, k;

    /* Compute each digit of result in sequence, maintaining the carries. */
    for (k = 0; k < uECC_WORDS; ++k) {
        for (i = 0; i <= k; ++i) {
            muladd(left[i], right[k - i], &r0, &r1, &r2);
        }
        result[k] = r0;
        r0 = r1;
        r1 = r2;
        r2 = 0;
    }
    for (k = uECC_WORDS; k < uECC_WORDS * 2 - 1; ++k) {
        for (i = (k + 1) - uECC_WORDS; i < uECC_WORDS; ++i) {
            muladd(left[i], right[k - i], &r0, &r1, &r2);
        }
        result[k] = r0;
        r0 = r1;
        r1 = r2;
        r2 = 0;
    }
    result[uECC_WORDS * 2 - 1] = r0;
}